

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CAnimatedMeshSceneNode.cpp
# Opt level: O2

bool __thiscall
irr::scene::CAnimatedMeshSceneNode::removeChild(CAnimatedMeshSceneNode *this,ISceneNode *child)

{
  pointer ppIVar1;
  ulong uVar2;
  bool bVar3;
  ulong uVar4;
  
  bVar3 = ISceneNode::removeChild((ISceneNode *)this,child);
  if ((bVar3) && (this->JointsUsed == true)) {
    ppIVar1 = (this->JointChildSceneNodes).m_data.
              super__Vector_base<irr::scene::IBoneSceneNode_*,_std::allocator<irr::scene::IBoneSceneNode_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    uVar2 = 0;
    do {
      uVar4 = uVar2;
      if (((ulong)((long)(this->JointChildSceneNodes).m_data.
                         super__Vector_base<irr::scene::IBoneSceneNode_*,_std::allocator<irr::scene::IBoneSceneNode_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)ppIVar1) >> 3 &
          0xffffffff) == uVar4) {
        return bVar3;
      }
      uVar2 = uVar4 + 1;
    } while (&ppIVar1[uVar4]->super_ISceneNode != child);
    ppIVar1[uVar4] = (IBoneSceneNode *)0x0;
  }
  return bVar3;
}

Assistant:

bool CAnimatedMeshSceneNode::removeChild(ISceneNode *child)
{
	if (ISceneNode::removeChild(child)) {
		if (JointsUsed) { // stop weird bugs caused while changing parents as the joints are being created
			for (u32 i = 0; i < JointChildSceneNodes.size(); ++i) {
				if (JointChildSceneNodes[i] == child) {
					JointChildSceneNodes[i] = 0; // remove link to child
					break;
				}
			}
		}
		return true;
	}

	return false;
}